

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_base64_encode_internal(char *target,char *data,int len,char *base64_encodes)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  char tmp1_2;
  char tmp2_1;
  char tmp3;
  char tmp1_1;
  char tmp1;
  char *pcStack_48;
  char tmp2;
  char *reader;
  char *writer;
  int target_size;
  int mod;
  int groups;
  char *base64_encodes_local;
  int len_local;
  char *data_local;
  char *target_local;
  
  target_size = len / 3;
  iVar4 = len % 3;
  iVar5 = ((target_size + 1) - (uint)(iVar4 == 0)) * 4;
  reader = target + (long)iVar5 + -1;
  pcVar6 = data + (long)len + -1;
  reader[1] = '\0';
  if (iVar4 == 1) {
    pcStack_48 = pcVar6 + -1;
    cVar1 = *pcVar6;
    *reader = '=';
    reader[-1] = '=';
    pcVar6 = reader + -3;
    reader[-2] = base64_encodes[(int)(((int)cVar1 & 3U) << 4)];
    reader = reader + -4;
    *pcVar6 = base64_encodes[(int)((int)cVar1 >> 2 & 0x3f)];
  }
  else {
    pcStack_48 = pcVar6;
    if (iVar4 == 2) {
      cVar1 = *pcVar6;
      pcStack_48 = pcVar6 + -2;
      cVar2 = pcVar6[-1];
      *reader = '=';
      reader[-1] = base64_encodes[(int)(((int)cVar1 & 0xfU) << 2)];
      pcVar6 = reader + -3;
      reader[-2] = base64_encodes[(int)(((int)cVar2 & 3U) << 4 | (int)cVar1 >> 4 & 0xfU)];
      reader = reader + -4;
      *pcVar6 = base64_encodes[(int)((int)cVar2 >> 2 & 0x3f)];
    }
  }
  while (target_size != 0) {
    target_size = target_size + -1;
    cVar1 = *pcStack_48;
    cVar2 = pcStack_48[-1];
    cVar3 = pcStack_48[-2];
    *reader = base64_encodes[(int)((int)cVar1 & 0x3f)];
    reader[-1] = base64_encodes[(int)(((int)cVar2 & 0xfU) << 2 | (int)cVar1 >> 6 & 3U)];
    pcVar6 = reader + -3;
    reader[-2] = base64_encodes[(int)(((int)cVar3 & 3U) << 4 | (int)cVar2 >> 4 & 0xfU)];
    reader = reader + -4;
    *pcVar6 = base64_encodes[(int)((int)cVar3 >> 2 & 0x3f)];
    pcStack_48 = pcStack_48 + -3;
  }
  return iVar5;
}

Assistant:

static inline int fio_base64_encode_internal(char *target, const char *data,
                                             int len,
                                             const char *base64_encodes) {
  /* walk backwards, allowing fo inplace decoding (target == data) */
  int groups = len / 3;
  const int mod = len - (groups * 3);
  const int target_size = (groups + (mod != 0)) * 4;
  char *writer = target + target_size - 1;
  const char *reader = data + len - 1;
  writer[1] = 0;
  switch (mod) {
  case 2: {
    char tmp2 = *(reader--);
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = base64_encodes[((tmp2 & 15) << 2)];
    *(writer--) = base64_encodes[((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15)];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  case 1: {
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = '=';
    *(writer--) = base64_encodes[(tmp1 & 3) << 4];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  }
  while (groups) {
    groups--;
    const char tmp3 = *(reader--);
    const char tmp2 = *(reader--);
    const char tmp1 = *(reader--);
    *(writer--) = base64_encodes[tmp3 & 63];
    *(writer--) = base64_encodes[((tmp2 & 15) << 2) | ((tmp3 >> 6) & 3)];
    *(writer--) = base64_encodes[(((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15))];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  }
  return target_size;
}